

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O2

bool bloaty::anon_unknown_0::ReadElfArchMode(InputFile *file,cs_arch *arch,cs_mode *mode)

{
  string_view data;
  bool bVar1;
  char *in_RCX;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  uint32_t in_R8D;
  undefined4 in_register_00000084;
  string_view sVar2;
  string_view sVar3;
  string_view format;
  bool capstone_available;
  anon_class_24_3_9b406a91 local_1c0;
  MemberReader reader;
  MemberFile member;
  ArFile ar_file;
  ElfFile elf;
  
  local_1c0.capstone_available = &capstone_available;
  capstone_available = true;
  local_1c0.arch = arch;
  local_1c0.mode = mode;
  ArFile::ArFile(&ar_file,file->data_);
  bVar1 = ArFile::IsOpen(&ar_file);
  if (bVar1) {
    member.filename._M_len = 0;
    member.filename._M_str = (char *)0x0;
    member.header._M_len = 0;
    member.header._M_str = (char *)0x0;
    member.contents._M_len = 0;
    member.contents._M_str = (char *)0x0;
    reader.long_filenames_._M_len = 0;
    reader.long_filenames_._M_str = (char *)0x0;
    reader.remaining_._M_len = ar_file.contents_._M_len;
    reader.remaining_._M_str = ar_file.contents_._M_str;
    while( true ) {
      bVar1 = ArFile::MemberReader::ReadMember(&reader,&member);
      if (!bVar1) break;
      if (member.file_type == kNormal) {
        data._M_str = member.contents._M_str;
        data._M_len = member.contents._M_len;
        ElfFile::ElfFile(&elf,data);
        if (elf.ok_ == true) {
          sVar2._M_str = in_RCX;
          sVar2._M_len = extraout_RDX;
          ReadElfArchMode::anon_class_24_3_9b406a91::operator()(&local_1c0,&elf,sVar2,in_R8D);
        }
      }
    }
  }
  else {
    ElfFile::ElfFile(&elf,file->data_);
    if (elf.ok_ == false) {
      member.filename._M_len = (size_t)(file->filename_)._M_dataplus._M_p;
      member._0_8_ = (file->filename_)._M_string_length;
      format._M_str = (char *)&member;
      format._M_len = (size_t)"Not an ELF or Archive file: $0";
      absl::Substitute_abi_cxx11_
                ((string *)&reader,(absl *)0x1e,format,(Arg *)CONCAT44(in_register_00000084,in_R8D))
      ;
      Throw((char *)reader.long_filenames_._M_len,0x2e2);
    }
    sVar3._M_str = in_RCX;
    sVar3._M_len = extraout_RDX_00;
    ReadElfArchMode::anon_class_24_3_9b406a91::operator()(&local_1c0,&elf,sVar3,in_R8D);
  }
  return capstone_available;
}

Assistant:

static bool ReadElfArchMode(const InputFile& file, cs_arch* arch, cs_mode* mode) {
  bool capstone_available = true;
  ForEachElf(file, nullptr,
             [&capstone_available, arch, mode](const ElfFile& elf,
                                               string_view /*filename*/,
                                               uint32_t /*index_base*/) {
               // Last .o file wins?  (For .a files)?  It's kind of arbitrary,
               // but a single .a file shouldn't have multiple archs in it.
               capstone_available &=
                   ElfMachineToCapstone(elf.header().e_machine, arch, mode);
             });
  return capstone_available;
}